

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

int ParseFile_CdnBuild(TCascStorage *hs,void *pvListFile)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcStack_30;
  int nError;
  char *szLineEnd;
  char *szLineBegin;
  void *pvListFile_local;
  TCascStorage *hs_local;
  
  pcStack_30 = (char *)0x0;
  szLineBegin = (char *)pvListFile;
  pvListFile_local = hs;
  ConvertIntegerToBytes_4(0xffffffff,(hs->EncodingFile).ContentSize);
  iVar2 = CASC_ARRAY::Create<_QUERY_KEY_PAIR>((CASC_ARRAY *)((long)pvListFile_local + 0x1a0),0x10);
  hs_local._4_4_ = iVar2;
  if (iVar2 == 0) {
    while (sVar3 = ListFile_GetNextLine(szLineBegin,&szLineEnd,&stack0xffffffffffffffd0), sVar3 != 0
          ) {
      bVar1 = CheckConfigFileVariable
                        ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"build-product",
                         LoadBuildProduct,(void *)0x0);
      if ((((((!bVar1) &&
             (bVar1 = CheckConfigFileVariable
                                ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"build-name",
                                 LoadBuildName,(void *)0x0), !bVar1)) &&
            (bVar1 = CheckConfigFileVariable
                               ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"root",
                                LoadCkeyEkey,(void *)((long)pvListFile_local + 0xde)), !bVar1)) &&
           ((bVar1 = CheckConfigFileVariable
                               ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"install",
                                LoadCkeyEkey,(void *)((long)pvListFile_local + 0x104)), !bVar1 &&
            (bVar1 = CheckConfigFileVariable
                               ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"download",
                                LoadCkeyEkey,(void *)((long)pvListFile_local + 0x12a)), !bVar1))))
          && ((bVar1 = CheckConfigFileVariable
                                 ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"encoding",
                                  LoadCkeyEkey,(void *)((long)pvListFile_local + 0xb8)), !bVar1 &&
              ((bVar1 = CheckConfigFileVariable
                                  ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,
                                   "encoding-size",LoadCkeyEkeySize,
                                   (void *)((long)pvListFile_local + 0xb8)), !bVar1 &&
               (bVar1 = CheckConfigFileVariable
                                  ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"patch",
                                   LoadCkeyEkey,(void *)((long)pvListFile_local + 0x150)), !bVar1)))
              ))) &&
         ((bVar1 = CheckConfigFileVariable
                             ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"vfs-root",
                              LoadCkeyEkey,(void *)((long)pvListFile_local + 0x176)), !bVar1 &&
          (bVar1 = CheckConfigFileVariable
                             ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"vfs-root-size",
                              LoadCkeyEkeySize,(void *)((long)pvListFile_local + 0x176)), !bVar1))))
      {
        CheckConfigFileVariable
                  ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"vfs-*",LoadVfsRootEntry,
                   (void *)((long)pvListFile_local + 0x1a0));
      }
    }
    bVar1 = IsValidMD5((LPBYTE)((long)pvListFile_local + 0xbe));
    if ((!bVar1) || (bVar1 = IsValidMD5((LPBYTE)((long)pvListFile_local + 0xce)), !bVar1)) {
      hs_local._4_4_ = 1000;
    }
  }
  return hs_local._4_4_;
}

Assistant:

static int ParseFile_CdnBuild(TCascStorage * hs, void * pvListFile)
{
    const char * szLineBegin;
    const char * szLineEnd = NULL;
    int nError;

    // Initialize the size of the internal files
    ConvertIntegerToBytes_4(CASC_INVALID_SIZE, hs->EncodingFile.ContentSize);

    // Initialize the empty VFS array
    nError = hs->VfsRootList.Create<QUERY_KEY_PAIR>(0x10);
    if (nError != ERROR_SUCCESS)
        return nError;

    // Parse all variables
    while(ListFile_GetNextLine(pvListFile, &szLineBegin, &szLineEnd) != 0)
    {
        // Product name and build name
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "build-product", LoadBuildProduct, NULL))
            continue;
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "build-name", LoadBuildName, NULL))
            continue;

        // Content key of the ROOT file. Look this up in ENCODING to get the encoded key
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "root", LoadCkeyEkey, &hs->RootFile))
            continue;

        // Content key [+ encoded key] of the INSTALL file
        // If CKey is absent, you need to query the ENCODING file for it
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "install", LoadCkeyEkey, &hs->InstallFile))
            continue;

        // Content key [+ encoded key] of the DOWNLOAD file
        // If CKey is absent, you need to query the ENCODING file for it
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "download", LoadCkeyEkey, &hs->DownloadFile))
            continue;

        // Content key + encoded key of the ENCODING file. Contains CKey+EKey
        // If either none or 1 is found, the game (at least Wow) switches to plain-data(?). Seen in build 20173 
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "encoding", LoadCkeyEkey, &hs->EncodingFile))
            continue;

        // Content and encoded size of the ENCODING file. This helps us to determine size
        // of the ENCODING file better, as the size in the EKEY entries is almost always wrong on WoW storages
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "encoding-size", LoadCkeyEkeySize, &hs->EncodingFile))
            continue;

        // PATCH file
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "patch", LoadCkeyEkey, &hs->PatchFile))
            continue;

        // Load the CKey+EKey of a VFS root file (the root file of the storage VFS)
        if (CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "vfs-root", LoadCkeyEkey, &hs->VfsRoot))
            continue;

        // Load the content size of the VFS root
        if (CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "vfs-root-size", LoadCkeyEkeySize, &hs->VfsRoot))
            continue;

        // Load a directory entry to the VFS
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "vfs-*", LoadVfsRootEntry, &hs->VfsRootList))
            continue;
    }

    // Both CKey and EKey of ENCODING file is required
    if(!IsValidMD5(hs->EncodingFile.CKey) || !IsValidMD5(hs->EncodingFile.EKey))
        return ERROR_BAD_FORMAT;
    return nError;
}